

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::operator==(MunitionDescriptor *this,MunitionDescriptor *Value)

{
  KBOOL KVar1;
  
  KVar1 = Descriptor::operator!=(&this->super_Descriptor,&Value->super_Descriptor);
  if ((((KVar1) || (this->m_ui16Warhead != Value->m_ui16Warhead)) ||
      (this->m_ui16Fuse != Value->m_ui16Fuse)) || (this->m_ui16Quantity != Value->m_ui16Quantity)) {
    KVar1 = false;
  }
  else {
    KVar1 = this->m_ui16Rate == Value->m_ui16Rate;
  }
  return KVar1;
}

Assistant:

KBOOL MunitionDescriptor::operator == ( const MunitionDescriptor & Value ) const
{
	if( Descriptor::operator != ( Value ) )            return false;
    if( m_ui16Warhead        != Value.m_ui16Warhead )  return false;
    if( m_ui16Fuse           != Value.m_ui16Fuse )     return false;
    if( m_ui16Quantity       != Value.m_ui16Quantity ) return false;
    if( m_ui16Rate           != Value.m_ui16Rate )     return false;
    return true;
}